

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCSwitchfinder.cpp
# Opt level: O1

void findSwitches(string *filename,string *outfile,string *reference)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  pointer pcVar5;
  undefined8 uVar6;
  string *psVar7;
  char cVar8;
  byte bVar9;
  pointer __dest;
  ostream *poVar10;
  _Base_ptr p_Var11;
  runtime_error *this;
  ulong uVar12;
  size_t __n;
  char *__args;
  long lVar13;
  uint uVar14;
  byte local_a11;
  string alignSequence;
  BamReader bamreader;
  vector<char,_std::allocator<char>_> cigar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RSCodes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FSCodes;
  vector<char,_std::allocator<char>_> local_978;
  string *local_958;
  string *local_950;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indRSTotalScores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RSQualCodes;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indFSTotalScores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FSQualCodes;
  string local_810;
  string local_7f0;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  RSSwitchMap;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  FSSwitchMap;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  vector<int,_std::allocator<int>_> local_6f0;
  vector<int,_std::allocator<int>_> local_6d8;
  vector<int,_std::allocator<int>_> qualityList;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSQualScoresFrequency;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSSwitchScoresFrequency
  ;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSReadScoresFrequency;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSQualScoresFrequency;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSSwitchScoresFrequency
  ;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSReadScoresFrequency;
  BamAlignment alignment;
  long local_560;
  long local_558;
  long local_520;
  long local_518;
  int local_4dc;
  char *local_4d0;
  char *local_4c8;
  ofstream FSSwitchFile;
  long local_428;
  char local_420 [8];
  undefined1 *local_418;
  long local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [176];
  ios_base aiStack_338 [264];
  ofstream RSSwitchFile;
  long local_228;
  undefined1 local_220 [232];
  ios_base aiStack_138 [264];
  
  local_950 = reference;
  BamTools::BamReader::BamReader(&bamreader);
  cVar8 = BamTools::BamReader::Open((string *)&bamreader);
  if (cVar8 == '\0') {
    BamTools::BamReader::GetFilename_abi_cxx11_();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,_FSSwitchFile,local_428);
    std::endl<char,std::char_traits<char>>(poVar10);
    if (_FSSwitchFile != local_420) {
      operator_delete(_FSSwitchFile);
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Couldn\'t open Bamfile");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_958 = outfile;
  BamTools::BamAlignment::BamAlignment(&alignment);
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header;
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  FSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  FSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  FSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indFSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indFSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indFSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  RSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  RSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  RSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  RSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indRSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indRSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indRSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    cVar8 = BamTools::BamReader::GetNextAlignment((BamAlignment *)&bamreader);
    if (cVar8 == '\0') {
      if (FSCodes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          FSCodes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar13 = 8;
        uVar12 = 0;
        do {
          lVar4 = *(long *)((long)FSCodes.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
          local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_710,lVar4,
                     *(long *)((long)&((FSCodes.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar13) + lVar4);
          lVar4 = *(long *)((long)FSQualCodes.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
          local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_730,lVar4,
                     *(long *)((long)&((FSQualCodes.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar13) + lVar4);
          scoreIndividualReads
                    (&local_710,&local_730,&FSReadScoresFrequency,&FSSwitchScoresFrequency,
                     &FSQualScoresFrequency,&indFSTotalScores,&FSSwitchMap);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_730._M_dataplus._M_p != &local_730.field_2) {
            operator_delete(local_730._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_710._M_dataplus._M_p != &local_710.field_2) {
            operator_delete(local_710._M_dataplus._M_p);
          }
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar12 < (ulong)((long)FSCodes.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)FSCodes.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if (RSCodes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          RSCodes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar13 = 8;
        uVar12 = 0;
        do {
          lVar4 = *(long *)((long)RSCodes.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
          local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_750,lVar4,
                     *(long *)((long)&((RSCodes.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar13) + lVar4);
          lVar4 = *(long *)((long)RSQualCodes.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
          local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_770,lVar4,
                     *(long *)((long)&((RSQualCodes.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar13) + lVar4);
          scoreIndividualReads
                    (&local_750,&local_770,&RSReadScoresFrequency,&RSSwitchScoresFrequency,
                     &RSQualScoresFrequency,&indRSTotalScores,&RSSwitchMap);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_770._M_dataplus._M_p != &local_770.field_2) {
            operator_delete(local_770._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_750._M_dataplus._M_p != &local_750.field_2) {
            operator_delete(local_750._M_dataplus._M_p);
          }
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar12 < (ulong)((long)RSCodes.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)RSCodes.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::ofstream::ofstream(&FSSwitchFile);
      std::ofstream::ofstream(&RSSwitchFile);
      psVar7 = local_958;
      paVar1 = &alignSequence.field_2;
      pcVar5 = (local_958->_M_dataplus)._M_p;
      alignSequence._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&alignSequence,pcVar5,pcVar5 + local_958->_M_string_length);
      std::__cxx11::string::append((char *)&alignSequence);
      std::ofstream::open((string *)&FSSwitchFile,(_Ios_Openmode)&alignSequence);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)alignSequence._M_dataplus._M_p != paVar1) {
        operator_delete(alignSequence._M_dataplus._M_p);
      }
      pcVar5 = (psVar7->_M_dataplus)._M_p;
      alignSequence._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&alignSequence,pcVar5,pcVar5 + psVar7->_M_string_length);
      std::__cxx11::string::append((char *)&alignSequence);
      std::ofstream::open((string *)&RSSwitchFile,(_Ios_Openmode)&alignSequence);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)alignSequence._M_dataplus._M_p != paVar1) {
        operator_delete(alignSequence._M_dataplus._M_p);
      }
      if ((_Rb_tree_header *)FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &FSSwitchMap._M_t._M_impl.super__Rb_tree_header) {
        p_Var11 = FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          iVar2 = *(int *)&p_Var11[1].field_0x4;
          iVar3 = *(int *)&p_Var11[1]._M_parent;
          poVar10 = (ostream *)
                    std::ostream::operator<<((ostream *)&FSSwitchFile,p_Var11[1]._M_color);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
          poVar10 = std::ostream::_M_insert<double>((double)iVar2 / (double)(iVar3 + iVar2));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (poVar10,*(int *)&p_Var11[1].field_0x4 + *(int *)&p_Var11[1]._M_parent
                              );
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(int *)&p_Var11[1].field_0x4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(int *)&p_Var11[1]._M_parent);
          alignSequence._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&alignSequence,1);
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != &FSSwitchMap._M_t._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &RSSwitchMap._M_t._M_impl.super__Rb_tree_header) {
        p_Var11 = RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          iVar2 = *(int *)&p_Var11[1].field_0x4;
          iVar3 = *(int *)&p_Var11[1]._M_parent;
          poVar10 = (ostream *)
                    std::ostream::operator<<((ostream *)&RSSwitchFile,p_Var11[1]._M_color);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
          poVar10 = std::ostream::_M_insert<double>((double)iVar2 / (double)(iVar3 + iVar2));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (poVar10,*(int *)&p_Var11[1].field_0x4 + *(int *)&p_Var11[1]._M_parent
                              );
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(int *)&p_Var11[1].field_0x4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    ",4);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(int *)&p_Var11[1]._M_parent);
          alignSequence._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&alignSequence,1);
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != &RSSwitchMap._M_t._M_impl.super__Rb_tree_header);
      }
      uVar6 = _memcpy;
      lVar13 = _VTT;
      _RSSwitchFile = (undefined1 *)_VTT;
      *(undefined8 *)(&RSSwitchFile + *(long *)(_VTT + -0x18)) = _memcpy;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(aiStack_138);
      _FSSwitchFile = (char *)lVar13;
      *(undefined8 *)(&FSSwitchFile + *(long *)(lVar13 + -0x18)) = uVar6;
      std::filebuf::~filebuf((filebuf *)&local_428);
      std::ios_base::~ios_base(aiStack_338);
      if (indRSTotalScores.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(indRSTotalScores.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&RSQualScoresFrequency._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&RSSwitchScoresFrequency._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&RSReadScoresFrequency._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&RSQualCodes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&RSCodes);
      if (indFSTotalScores.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(indFSTotalScores.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&FSQualScoresFrequency._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&FSSwitchScoresFrequency._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&FSReadScoresFrequency._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&FSQualCodes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&FSCodes);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
      ::~_Rb_tree(&RSSwitchMap._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
      ::~_Rb_tree(&FSSwitchMap._M_t);
      BamTools::BamAlignment::~BamAlignment(&alignment);
      BamTools::BamReader::~BamReader(&bamreader);
      return;
    }
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (__args = local_4d0; __args != local_4c8; __args = __args + 8) {
      if (*(int *)(__args + 4) != 0) {
        uVar14 = 0;
        do {
          if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&cigar,
                       (iterator)
                       cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,__args);
          }
          else {
            *cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish = *__args;
            cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish = cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < *(uint *)(__args + 4));
      }
    }
    local_978.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_978.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_978.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar12 = (long)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar12 == 0) {
      __dest = (pointer)0x0;
    }
    else {
      if ((long)uVar12 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = (pointer)operator_new(uVar12);
    }
    local_978.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = __dest + uVar12;
    __n = (long)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_978.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = __dest;
    if (__n != 0) {
      local_978.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = __dest;
      memmove(__dest,cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
    }
    local_978.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = __dest + __n;
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_908,local_560,local_558 + local_560);
    local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_8a8,local_520,local_518 + local_520);
    referenceString((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                     *)&FSSwitchFile,&local_978,local_4dc,&local_908,local_950,&local_8a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
      operator_delete(local_8a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_908._M_dataplus._M_p != &local_908.field_2) {
      operator_delete(local_908._M_dataplus._M_p);
    }
    if (__dest != (pointer)0x0) {
      operator_delete(__dest);
    }
    _RSSwitchFile = local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&RSSwitchFile,local_3f8,local_3f8 + local_3f0);
    alignSequence._M_dataplus._M_p = (pointer)&alignSequence.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&alignSequence,local_418,local_418 + local_410);
    std::vector<int,_std::allocator<int>_>::vector
              (&qualityList,(vector<int,_std::allocator<int>_> *)&FSSwitchFile);
    cVar8 = BamTools::BamAlignment::IsPaired();
    if (cVar8 == '\0') {
      bVar9 = BamTools::BamAlignment::IsReverseStrand();
LAB_00108212:
      local_a11 = bVar9 ^ 1;
    }
    else {
      cVar8 = BamTools::BamAlignment::IsFirstMate();
      if (cVar8 != '\0') {
        bVar9 = BamTools::BamAlignment::IsReverseStrand();
        goto LAB_00108212;
      }
      cVar8 = BamTools::BamAlignment::IsSecondMate();
      if (cVar8 != '\0') {
        local_a11 = BamTools::BamAlignment::IsReverseStrand();
      }
    }
    if ((local_a11 & 1) == 0) {
      local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8c8,_RSSwitchFile,_RSSwitchFile + local_228);
      complement(&local_7f0,&local_8c8);
      local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8e8,alignSequence._M_dataplus._M_p,
                 alignSequence._M_dataplus._M_p + alignSequence._M_string_length);
      complement(&local_810,&local_8e8);
      std::vector<int,_std::allocator<int>_>::vector(&local_6f0,&qualityList);
      RFSAndRRSSwitchDetermination(&codes,&local_7f0,&local_810,&local_6f0,&RSSwitchMap,'G','C','T')
      ;
      if (local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_810._M_dataplus._M_p != &local_810.field_2) {
        operator_delete(local_810._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
        operator_delete(local_8e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
        operator_delete(local_8c8._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&RSCodes,codes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&RSQualCodes,
                  codes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
      local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_928,_RSSwitchFile,_RSSwitchFile + local_228);
      local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_948,alignSequence._M_dataplus._M_p,
                 alignSequence._M_dataplus._M_p + alignSequence._M_string_length);
      std::vector<int,_std::allocator<int>_>::vector(&local_6d8,&qualityList);
      FFSAndFRSSwitchDetermination(&codes,&local_928,&local_948,&local_6d8,&FSSwitchMap,'G','C','T')
      ;
      if (local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_dataplus._M_p != &local_948.field_2) {
        operator_delete(local_948._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_928._M_dataplus._M_p != &local_928.field_2) {
        operator_delete(local_928._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&FSCodes,codes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&FSQualCodes,
                  codes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&codes);
    if (qualityList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(qualityList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)alignSequence._M_dataplus._M_p != &alignSequence.field_2) {
      operator_delete(alignSequence._M_dataplus._M_p);
    }
    if (_RSSwitchFile != local_220) {
      operator_delete(_RSSwitchFile);
    }
    if (local_3f8 != local_3e8) {
      operator_delete(local_3f8);
    }
    if (local_418 != local_408) {
      operator_delete(local_418);
    }
    if (_FSSwitchFile != (char *)0x0) {
      operator_delete(_FSSwitchFile);
    }
    if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while( true );
}

Assistant:

void findSwitches(string filename , string outfile, string & reference) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;
    std::map<int,std::pair<int,int>> FSSwitchMap;// map containg switch and nonswitch values for FS reads
    std::map<int,std::pair<int,int>> RSSwitchMap;// map containg switch and nonswitch values for RS reads
    vector<string> FSCodes;
    vector<string> FSQualCodes;
    std::map<int,int> FSReadScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> FSSwitchScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> FSQualScoresFrequency;// map contating the score frequencies for FS reads
    std::vector<pair<int,int>> indFSTotalScores;// vector contating the individual score for FS reads
    vector<string> RSCodes;
    vector<string> RSQualCodes;
    std::map<int,int> RSReadScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> RSSwitchScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> RSQualScoresFrequency;// map contating the score frequencies for FS reads
    std::vector<pair<int,int>> indRSTotalScores;// map contating the individual score for RS reads

    while (bamreader.GetNextAlignment(alignment)){
        std::vector<char> cigar;
        for (const auto& it : alignment.CigarData) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                cigar.push_back(it.Type);
            }
        }
        std::tuple<string,string,vector<int>> ref = referenceString(cigar,alignment.Position,alignment.QueryBases,reference,alignment.Qualities);
        string constructedReference = std::get<0>(ref);
        string alignSequence = std::get<1>(ref);
        vector<int> qualityList = std::get<2>(ref);


        bool strand1;
        if(!alignment.IsPaired()){
        strand1 = !alignment.IsReverseStrand();
        }else{
            if(alignment.IsFirstMate()){
                if(!alignment.IsReverseStrand()){
                    strand1=true;
                }else{
                    strand1=false;
                }
            }else if(alignment.IsSecondMate()){
                if(!alignment.IsReverseStrand()){
                    strand1=false;
                }else{
                    strand1=true;
                }
            }
        }

        // All the reads in a bam file are stored in the forward direction. So for OT and CTOT we dont chenge anything since they are forward reads
        // For OB and CTOB we take the compliment of both since we want both to be aligned to the reverse strand
        if(strand1){//OT nad CTOT
            vector<string> codes= FFSAndFRSSwitchDetermination(constructedReference,alignSequence,qualityList,FSSwitchMap,'G','C','T');
            FSCodes.push_back(codes[0]);
            FSQualCodes.push_back(codes[1]);
        }else if(!strand1){//OB and CTOB
            vector<string> codes= RFSAndRRSSwitchDetermination(complement(constructedReference),complement(alignSequence),qualityList,RSSwitchMap,'G','C','T');
            RSCodes.push_back(codes[0]);
            RSQualCodes.push_back(codes[1]);
        }


    }

    //Scoring forward strand reads
    for(int i = 0; i<FSCodes.size(); i++){
        scoreIndividualReads(FSCodes[i],FSQualCodes[i],FSReadScoresFrequency,FSSwitchScoresFrequency,FSQualScoresFrequency,indFSTotalScores,FSSwitchMap);
    }
    //Scoring reverse strand reads
    for(int i = 0; i<RSCodes.size(); i++){
        scoreIndividualReads(RSCodes[i],RSQualCodes[i],RSReadScoresFrequency,RSSwitchScoresFrequency,RSQualScoresFrequency,indRSTotalScores,RSSwitchMap);
    }



    ofstream FSSwitchFile;
    ofstream RSSwitchFile;

    FSSwitchFile.open (outfile+"FSSwitches.txt");
    RSSwitchFile.open (outfile+"RSSwitches.txt");

    //Outfile(switchrates) format: distance | switch/switch+nonSwitch | switch+nonSwitch | switch | nonSwitch

    std::map<int,std::pair<int,int>>::iterator it = FSSwitchMap.begin();
    for (it=FSSwitchMap.begin(); it!=FSSwitchMap.end(); ++it){
        double stat;
        stat = it->second.first/(double)(it->second.second+it->second.first);
        FSSwitchFile << it->first << "    " << stat <<"    "<<it->second.second+it->second.first<<"    "<<it->second.first<<"    "<<it->second.second<< '\n';

    }


    std::map<int,std::pair<int,int>>::iterator it3 = RSSwitchMap.begin();
    for (it3=RSSwitchMap.begin(); it3!=RSSwitchMap.end(); ++it3){
        double stat;
        stat = it3->second.first/(double)(it3->second.second+it3->second.first);
        RSSwitchFile << it3->first << "    " << stat <<"    "<<it3->second.second+it3->second.first<<"    "<<it3->second.first<<"    "<<it3->second.second<< '\n';

    }

}